

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_test.c
# Opt level: O0

int local_error(int code,char *fmt,...)

{
  int __status;
  int in_ECX;
  char *in_RDX;
  va_list ap;
  int ret;
  __va_list_tag *in_stack_ffffffffffffff20;
  
  __status = zt_opt_verror_default(in_ECX,in_RDX,in_stack_ffffffffffffff20);
  if (__status != 0) {
    exit(__status);
  }
  return 0;
}

Assistant:

int
local_error(int code, char * fmt, ...) {
    /* we could capture any errors here
     * instead we will fail explicitly if
     * we get any.
     */
    int     ret;
    va_list ap;

    va_start(ap, fmt);
    ret = zt_opt_verror_default(code, fmt, ap);
    va_end(ap);

    if(ret != 0) {
        exit(ret);
    }

    return 0;
}